

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_inflateInit2(mz_streamp pStream,int window_bits)

{
  mz_internal_state *pmVar1;
  inflate_state *pDecomp;
  int window_bits_local;
  mz_streamp pStream_local;
  
  if (pStream == (mz_streamp)0x0) {
    pStream_local._4_4_ = -2;
  }
  else if ((window_bits == 0xf) || (window_bits == -0xf)) {
    pStream->data_type = 0;
    pStream->adler = 0;
    pStream->msg = (char *)0x0;
    pStream->total_in = 0;
    pStream->total_out = 0;
    pStream->reserved = 0;
    if (pStream->zalloc == (mz_alloc_func)0x0) {
      pStream->zalloc = miniz_def_alloc_func;
    }
    if (pStream->zfree == (mz_free_func)0x0) {
      pStream->zfree = miniz_def_free_func;
    }
    pmVar1 = (mz_internal_state *)(*pStream->zalloc)(pStream->opaque,1,0xab10);
    if (pmVar1 == (mz_internal_state *)0x0) {
      pStream_local._4_4_ = -4;
    }
    else {
      pStream->state = pmVar1;
      *(undefined4 *)pmVar1 = 0;
      *(undefined4 *)(pmVar1 + 11000) = 0;
      *(undefined4 *)(pmVar1 + 0x2afc) = 0;
      *(undefined4 *)(pmVar1 + 0xab0c) = 1;
      *(undefined4 *)(pmVar1 + 0x2b00) = 1;
      *(undefined4 *)(pmVar1 + 0x2b04) = 0;
      *(int *)(pmVar1 + 0x2b08) = window_bits;
      pStream_local._4_4_ = 0;
    }
  }
  else {
    pStream_local._4_4_ = -10000;
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_inflateInit2(mz_streamp pStream, int window_bits)
{
    inflate_state *pDecomp;
    if (!pStream)
        return MZ_STREAM_ERROR;
    if ((window_bits != MZ_DEFAULT_WINDOW_BITS) && (-window_bits != MZ_DEFAULT_WINDOW_BITS))
        return MZ_PARAM_ERROR;

    pStream->data_type = 0;
    pStream->adler = 0;
    pStream->msg = NULL;
    pStream->total_in = 0;
    pStream->total_out = 0;
    pStream->reserved = 0;
    if (!pStream->zalloc)
        pStream->zalloc = miniz_def_alloc_func;
    if (!pStream->zfree)
        pStream->zfree = miniz_def_free_func;

    pDecomp = (inflate_state *)pStream->zalloc(pStream->opaque, 1, sizeof(inflate_state));
    if (!pDecomp)
        return MZ_MEM_ERROR;

    pStream->state = (struct mz_internal_state *)pDecomp;

    tinfl_init(&pDecomp->m_decomp);
    pDecomp->m_dict_ofs = 0;
    pDecomp->m_dict_avail = 0;
    pDecomp->m_last_status = TINFL_STATUS_NEEDS_MORE_INPUT;
    pDecomp->m_first_call = 1;
    pDecomp->m_has_flushed = 0;
    pDecomp->m_window_bits = window_bits;

    return MZ_OK;
}